

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

void __thiscall tonk::gateway::StateMachine::API_Request(StateMachine *this,AppRequest *request)

{
  pointer *ppAVar1;
  pointer pAVar2;
  pointer pAVar3;
  iterator __position;
  MappedPortLifetime *pMVar4;
  undefined2 uVar5;
  RequestType RVar6;
  int iVar7;
  pointer pAVar8;
  bool bVar9;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->API_Lock);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pAVar2 = (this->API_Requests).
           super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->API_Requests).
           super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar2 != pAVar3) {
    bVar9 = false;
    do {
      pAVar8 = pAVar2 + 1;
      if (pAVar2->LocalPort == request->LocalPort) {
        uVar5 = *(undefined2 *)&request->field_0x2;
        RVar6 = request->Type;
        pMVar4 = request->API_LifetimePtr;
        pAVar2->LocalPort = request->LocalPort;
        *(undefined2 *)&pAVar2->field_0x2 = uVar5;
        pAVar2->Type = RVar6;
        pAVar2->API_LifetimePtr = pMVar4;
        bVar9 = true;
        break;
      }
      pAVar2 = pAVar8;
    } while (pAVar8 != pAVar3);
    if (bVar9) goto LAB_00157f44;
  }
  __position._M_current =
       (this->API_Requests).
       super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->API_Requests).
      super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<tonk::gateway::AppRequest,std::allocator<tonk::gateway::AppRequest>>::
    _M_realloc_insert<tonk::gateway::AppRequest_const&>
              ((vector<tonk::gateway::AppRequest,std::allocator<tonk::gateway::AppRequest>> *)
               &this->API_Requests,__position,request);
  }
  else {
    uVar5 = *(undefined2 *)&request->field_0x2;
    RVar6 = request->Type;
    pMVar4 = request->API_LifetimePtr;
    (__position._M_current)->LocalPort = request->LocalPort;
    *(undefined2 *)&(__position._M_current)->field_0x2 = uVar5;
    (__position._M_current)->Type = RVar6;
    (__position._M_current)->API_LifetimePtr = pMVar4;
    ppAVar1 = &(this->API_Requests).
               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
LAB_00157f44:
  LOCK();
  (this->API_Requests_Updated)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->API_Lock);
  AsioHost::DispatchTick(this->Host);
  return;
}

Assistant:

void StateMachine::API_Request(const AppRequest& request)
{
    TONK_DEBUG_ASSERT(request.LocalPort != 0);

    // This will be called from the application

    // Hold API lock while accessing the requests list
    {
        std::lock_guard<std::mutex> locker(API_Lock);

        bool found = false;
        for (auto& r : API_Requests)
        {
            // Note: Requests are uniquely identified by ports
            if (r.LocalPort == request.LocalPort)
            {
                r = request;
                found = true;
                break;
            }
        }

        if (!found) {
            API_Requests.push_back(request);
        }

        // Set the dirty flag
        API_Requests_Updated = true;
    }

    // Run OnTick() immediately
    Host->DispatchTick();
}